

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O0

bool __thiscall
SphereTriangleDetector::collide
          (SphereTriangleDetector *this,btVector3 *sphereCenter,btVector3 *point,
          btVector3 *resultNormal,btScalar *depth,btScalar *timeOfImpact,
          btScalar contactBreakingThreshold)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  btScalar *in_RCX;
  btScalar *in_RDX;
  btSphereShape *in_RSI;
  btVector3 *in_RDI;
  float *in_R8;
  float in_XMM0_Da;
  float fVar4;
  btScalar bVar5;
  btVector3 bVar6;
  btScalar distance;
  btScalar distanceSqr_1;
  btVector3 contactToCentre;
  btScalar distanceSqr;
  btVector3 pb;
  btVector3 pa;
  int i;
  btVector3 nearestOnEdge;
  btScalar contactCapsuleRadiusSqr;
  btVector3 contactPoint;
  bool hasContact;
  bool isInsideContactPlane;
  btScalar distanceFromPlane;
  btVector3 p1ToCentre;
  btVector3 normal;
  btScalar radiusWithThreshold;
  btScalar radius;
  btVector3 *vertices;
  btSphereShape *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee8 [16];
  undefined4 in_stack_fffffffffffffef8;
  btScalar in_stack_fffffffffffffefc;
  SphereTriangleDetector *in_stack_ffffffffffffff00;
  btVector3 local_f4;
  int local_e4;
  btScalar local_e0 [2];
  btVector3 *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff34;
  btVector3 *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  btVector3 *local_b4;
  undefined1 local_ac [18];
  byte local_9a;
  byte local_99;
  btScalar local_98;
  float local_94;
  btVector3 local_90;
  btScalar local_80 [4];
  btScalar local_70 [4];
  btVector3 local_60;
  float local_50;
  float local_4c;
  btVector3 *local_48;
  float local_3c;
  float *local_30;
  btScalar *local_28;
  btScalar *local_20;
  btSphereShape *local_18;
  
  local_3c = in_XMM0_Da;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_48 = btTriangleShape::getVertexPtr(*(btTriangleShape **)in_RDI[1].m_floats,0);
  local_4c = btSphereShape::getRadius(in_stack_fffffffffffffed0);
  local_50 = local_4c + local_3c;
  local_70 = (btScalar  [4])
             operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_RDI);
  local_80 = (btScalar  [4])
             operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_RDI);
  local_60 = btVector3::cross((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_RDI);
  btVector3::normalize((btVector3 *)in_stack_fffffffffffffed0);
  local_90 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_RDI);
  local_94 = btVector3::dot(&local_90,&local_60);
  if (local_94 < 0.0) {
    local_94 = local_94 * -1.0;
    local_98 = -1.0;
    btVector3::operator*=(&local_60,&local_98);
  }
  local_99 = local_94 < local_50;
  local_9a = 0;
  btVector3::btVector3((btVector3 *)local_ac);
  if ((local_99 & 1) != 0) {
    bVar2 = facecontains(in_stack_ffffffffffffff00,
                         (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_fffffffffffffee8._8_8_,in_stack_fffffffffffffee8._0_8_);
    if (bVar2) {
      local_9a = 1;
      ::operator*((btVector3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  in_RDI->m_floats);
      bVar6 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_RDI);
      local_b4 = bVar6.m_floats._8_8_;
      local_ac._0_8_ = bVar6.m_floats._0_8_;
      local_ac._8_8_ = local_b4;
      in_stack_fffffffffffffed0 = local_18;
    }
    else {
      fVar4 = local_50 * local_50;
      btVector3::btVector3((btVector3 *)local_e0);
      for (local_e4 = 0; iVar1 = local_e4,
          iVar3 = (**(code **)(**(long **)in_RDI[1].m_floats + 200))(), iVar1 < iVar3;
          local_e4 = local_e4 + 1) {
        btVector3::btVector3(&local_f4);
        btVector3::btVector3((btVector3 *)&stack0xfffffffffffffefc);
        (**(code **)(**(long **)in_RDI[1].m_floats + 0xd0))
                  (*(long **)in_RDI[1].m_floats,local_e4,&local_f4,&stack0xfffffffffffffefc);
        bVar5 = SegmentSqrDistance((btVector3 *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                   in_stack_ffffffffffffff38,
                                   (btVector3 *)CONCAT44(in_stack_ffffffffffffff34,fVar4),
                                   in_stack_ffffffffffffff28);
        if (bVar5 < fVar4) {
          local_9a = 1;
          local_ac._0_4_ = local_e0[0];
          local_ac._4_4_ = local_e0[1];
          local_ac._8_8_ = in_stack_ffffffffffffff28;
        }
      }
    }
  }
  if ((local_9a & 1) != 0) {
    bVar6 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      in_RDI);
    bVar5 = btVector3::length2((btVector3 *)0x1a56e7);
    if (bVar5 < local_50 * local_50) {
      if (bVar5 <= 1.1920929e-07) {
        *(undefined8 *)local_28 = local_60.m_floats._0_8_;
        *(undefined8 *)(local_28 + 2) = local_60.m_floats._8_8_;
        *(undefined8 *)local_20 = local_ac._0_8_;
        *(undefined8 *)(local_20 + 2) = local_ac._8_8_;
        *local_30 = -local_4c;
      }
      else {
        bVar5 = btSqrt(0.0);
        *(long *)local_28 = bVar6.m_floats._0_8_;
        *(long *)(local_28 + 2) = bVar6.m_floats._8_8_;
        btVector3::normalize((btVector3 *)in_stack_fffffffffffffed0);
        *(undefined8 *)local_20 = local_ac._0_8_;
        *(undefined8 *)(local_20 + 2) = local_ac._8_8_;
        *local_30 = -(local_4c - bVar5);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool SphereTriangleDetector::collide(const btVector3& sphereCenter,btVector3 &point, btVector3& resultNormal, btScalar& depth, btScalar &timeOfImpact, btScalar contactBreakingThreshold)
{

	const btVector3* vertices = &m_triangle->getVertexPtr(0);
	
	btScalar radius = m_sphere->getRadius();
	btScalar radiusWithThreshold = radius + contactBreakingThreshold;

	btVector3 normal = (vertices[1]-vertices[0]).cross(vertices[2]-vertices[0]);
	normal.normalize();
	btVector3 p1ToCentre = sphereCenter - vertices[0];
	btScalar distanceFromPlane = p1ToCentre.dot(normal);

	if (distanceFromPlane < btScalar(0.))
	{
		//triangle facing the other way
		distanceFromPlane *= btScalar(-1.);
		normal *= btScalar(-1.);
	}

	bool isInsideContactPlane = distanceFromPlane < radiusWithThreshold;
	
	// Check for contact / intersection
	bool hasContact = false;
	btVector3 contactPoint;
	if (isInsideContactPlane) {
		if (facecontains(sphereCenter,vertices,normal)) {
			// Inside the contact wedge - touches a point on the shell plane
			hasContact = true;
			contactPoint = sphereCenter - normal*distanceFromPlane;
		} else {
			// Could be inside one of the contact capsules
			btScalar contactCapsuleRadiusSqr = radiusWithThreshold*radiusWithThreshold;
			btVector3 nearestOnEdge;
			for (int i = 0; i < m_triangle->getNumEdges(); i++) {
				
				btVector3 pa;
				btVector3 pb;
				
				m_triangle->getEdge(i,pa,pb);

				btScalar distanceSqr = SegmentSqrDistance(pa,pb,sphereCenter, nearestOnEdge);
				if (distanceSqr < contactCapsuleRadiusSqr) {
					// Yep, we're inside a capsule
					hasContact = true;
					contactPoint = nearestOnEdge;
				}
				
			}
		}
	}

	if (hasContact) {
		btVector3 contactToCentre = sphereCenter - contactPoint;
		btScalar distanceSqr = contactToCentre.length2();

		if (distanceSqr < radiusWithThreshold*radiusWithThreshold)
		{
			if (distanceSqr>SIMD_EPSILON)
			{
				btScalar distance = btSqrt(distanceSqr);
				resultNormal = contactToCentre;
				resultNormal.normalize();
				point = contactPoint;
				depth = -(radius-distance);
			} else
			{
				resultNormal = normal;
				point = contactPoint;
				depth = -radius;
			}
			return true;
		}
	}
	
	return false;
}